

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteKvIoPageUnRef(unqlite_page *pPage)

{
  int iVar1;
  uint uVar2;
  Pager *pPager;
  Page *pPVar3;
  long lVar4;
  long *plVar5;
  Page **ppPVar6;
  Page **ppPVar7;
  
  if (pPage == (unqlite_page *)0x0) {
    return 0;
  }
  plVar5 = *(long **)pPage[1].zData;
  lVar4 = *plVar5;
  if (lVar4 == 0) {
    lVar4 = 0;
  }
  else if (plVar5[6] != 0) {
    (**(code **)(lVar4 + 0x20))();
    plVar5 = *(long **)pPage[1].zData;
    lVar4 = *plVar5;
  }
  iVar1 = *(int *)((long)&pPage[1].pUserData + 4);
  *(int *)((long)&pPage[1].pUserData + 4) = iVar1 + -1;
  if ((lVar4 != 0) && (plVar5[6] != 0)) {
    (**(code **)(lVar4 + 0x30))();
  }
  if (iVar1 != 0) {
    return 0;
  }
  pPager = (Pager *)pPage[1].zData;
  uVar2 = *(uint *)&pPage[1].pUserData;
  if ((uVar2 & 2) == 0) {
    pager_unlink_page(pPager,(Page *)pPage);
    pager_release_page(pPager,(Page *)pPage);
    return 0;
  }
  if ((uVar2 & 0xc0) != 0) {
    return 0;
  }
  pPage[4].zData = (uchar *)0x0;
  ppPVar7 = &pPager->pHotDirty;
  if (pPager->pFirstHot == (Page *)0x0) {
    ppPVar6 = &pPager->pFirstHot;
  }
  else {
    pPVar3 = *ppPVar7;
    pPage[3].iPage = (pgno)pPVar3;
    ppPVar6 = ppPVar7;
    if (pPVar3 == (Page *)0x0) goto LAB_00114dd3;
    ppPVar7 = &pPVar3->pPrevHot;
  }
  *ppPVar7 = (Page *)pPage;
LAB_00114dd3:
  *ppPVar6 = (Page *)pPage;
  pPager->nHot = pPager->nHot + 1;
  *(uint *)&pPage[1].pUserData = uVar2 | 0x40;
  return 0;
}

Assistant:

static int unqliteKvIoPageUnRef(unqlite_page *pPage)
{
	if( pPage ){
		page_unref((Page *)pPage);
	}
	return UNQLITE_OK;
}